

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O2

void __thiscall SocketPP::TCPServer::onDisconnected(TCPServer *this,int fd)

{
  TCPStream *pTVar1;
  long lVar2;
  long lVar3;
  const_iterator __position;
  TCPStream local_1c;
  
  std::mutex::lock(&this->streamMutex_);
  __position._M_current =
       (this->connectedStreams_).
       super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
       super__Vector_impl_data._M_start;
  pTVar1 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pTVar1 - (long)__position._M_current;
  for (lVar3 = lVar2 >> 4; 0 < lVar3; lVar3 = lVar3 + -1) {
    if ((__position._M_current)->fd == fd) goto LAB_00105e2b;
    if (__position._M_current[1].fd == fd) {
      __position._M_current = __position._M_current + 1;
      goto LAB_00105e2b;
    }
    if (__position._M_current[2].fd == fd) {
      __position._M_current = __position._M_current + 2;
      goto LAB_00105e2b;
    }
    if (__position._M_current[3].fd == fd) {
      __position._M_current = __position._M_current + 3;
      goto LAB_00105e2b;
    }
    __position._M_current = __position._M_current + 4;
    lVar2 = lVar2 + -0x10;
  }
  lVar2 = lVar2 >> 2;
  if (lVar2 == 1) {
LAB_00105e13:
    if ((__position._M_current)->fd != fd) {
      __position._M_current = pTVar1;
    }
LAB_00105e2b:
    if (__position._M_current != pTVar1) {
      std::vector<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>::erase
                (&this->connectedStreams_,__position);
      printf("\x1b[33m%s: connectedStreams_.size()=%ld\x1b[m\n","TCPServer.cpp",
             (long)(this->connectedStreams_).
                   super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->connectedStreams_).
                   super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2);
      if ((this->discHandle_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_1c.fd = fd;
        std::function<void_(const_SocketPP::TCPStream_&)>::operator()(&this->discHandle_,&local_1c);
      }
      goto LAB_00105e9c;
    }
  }
  else {
    if (lVar2 == 2) {
LAB_00105e0b:
      if ((__position._M_current)->fd != fd) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00105e13;
      }
      goto LAB_00105e2b;
    }
    if (lVar2 == 3) {
      if ((__position._M_current)->fd != fd) {
        __position._M_current = __position._M_current + 1;
        goto LAB_00105e0b;
      }
      goto LAB_00105e2b;
    }
  }
  printf("\x1b[31mERROR: %s: %s: %d: fd:%d is not in connectedStreams_!\x1b[m\n","TCPServer.cpp",
         "onDisconnected",0xa6,fd);
LAB_00105e9c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
  return;
}

Assistant:

void TCPServer::onDisconnected(int fd) {
    std::lock_guard<std::mutex> lockStream(streamMutex_);
    auto iter = std::find_if(connectedStreams_.cbegin(), connectedStreams_.cend(),
                             [&](TCPStream stream) { return stream.fd == fd; });

    if (iter == connectedStreams_.cend()) {
        LOGE("fd:%d is not in connectedStreams_!", fd);
        return;
    }

    connectedStreams_.erase(iter);

    LOGD("connectedStreams_.size()=%ld", connectedStreams_.size());

    if (discHandle_)
        discHandle_(fd);
}